

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcEmbedTokenList::reduce(CTcEmbedTokenList *this,CTcStrTemplate *tpl)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  CTcTokenEle *dst;
  CTcTokenEle *src;
  bool bVar5;
  
  dst = this->head;
  iVar1 = this->cnt;
  iVar4 = *(int *)(tpl + 0x10);
  lVar3 = *(long *)tpl;
  src = dst;
  if (lVar3 == 0 || dst == (CTcTokenEle *)0x0) {
    iVar2 = (iVar1 - iVar4) + 1;
    this->cnt = iVar2;
  }
  else {
    while ((*(long *)(lVar3 + 0x10) != 1 || (**(char **)(lVar3 + 8) != '*'))) {
      src = src->nxt_;
      iVar1 = iVar1 + -1;
      iVar4 = iVar4 + -1;
      if ((src == (CTcTokenEle *)0x0) || (lVar3 = *(long *)(lVar3 + 0x28), lVar3 == 0)) break;
    }
    iVar2 = (iVar1 - iVar4) + 1;
    this->cnt = iVar2;
    if (((src != dst) && (src != (CTcTokenEle *)0x0)) && (iVar2 != 0)) {
      iVar1 = iVar4 - iVar1;
      do {
        CTcTokenizer::copytok(G_tok,&dst->super_CTcToken,&src->super_CTcToken);
        src = src->nxt_;
        if (src == (CTcTokenEle *)0x0) break;
        dst = dst->nxt_;
        bVar5 = iVar1 != 0;
        iVar1 = iVar1 + 1;
      } while (bVar5);
      dst = this->head;
      iVar2 = this->cnt;
    }
  }
  this->wrt = dst;
  for (; iVar2 != 0; iVar2 = iVar2 + -1) {
    dst = dst->nxt_;
    this->wrt = dst;
  }
  return;
}

Assistant:

void reduce(CTcStrTemplate *tpl)
    {
        /* find the first token in our list matching '*' in the template */
        CTcTokenEle *src, *tele;
        int rem, trem;
        for (src = head, tele = tpl->head, rem = cnt, trem = tpl->cnt ;
             src != 0 && tele != 0 ;
             src = src->getnxt(), tele = tele->getnxt(), --rem, --trem)
        {
            /* stop when we reach '*' in the template */
            if (tele->text_matches("*", 1))
                break;
        }

        /* skip the '*' in the template */
        trem -= 1;

        /* 
         *   The number of tokens matching '*' is the number left in our
         *   list, minus the number left in the token list after the '*'.
         */
        rem -= trem;
        cnt = rem;

        /* if we had any leading fixed tokens to remove, remove them */
        if (src != head)
        {
            CTcTokenEle *dst;
            for (dst = head ; rem != 0 && src != 0 ;
                 src = src->getnxt(), dst = dst->getnxt(), --rem)
            {
                /* copy this token */
                G_tok->copytok(dst, src);
            }
        }

        /* move the write pointer to the proper position */
        for (wrt = head, rem = cnt ; rem != 0 ; wrt = wrt->getnxt(), --rem) ;
    }